

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O2

void sort_areas(void)

{
  AREA_DATA_conflict *pAVar1;
  AREA_DATA_conflict *pAVar2;
  AREA_DATA_conflict *pAVar3;
  bool bVar4;
  int iVar5;
  AREA_DATA_conflict **ppAVar6;
  bool bVar7;
  
  bVar7 = true;
  ppAVar6 = &area_first;
  do {
    while ((ppAVar6 = &((AREA_DATA_conflict *)ppAVar6)->next->next,
           (AREA_DATA_conflict *)ppAVar6 != (AREA_DATA_conflict *)0x0 &&
           (pAVar1 = ((AREA_DATA_conflict *)ppAVar6)->next, pAVar1 != (AREA_DATA_conflict *)0x0))) {
      if (pAVar1->min_vnum < ((AREA_DATA_conflict *)ppAVar6)->min_vnum) {
        pAVar2 = pAVar1->next;
        if (pAVar2 != (AREA_DATA_conflict *)0x0) {
          pAVar2->prev = (AREA_DATA_conflict *)ppAVar6;
        }
        pAVar3 = ((AREA_DATA_conflict *)ppAVar6)->prev;
        bVar7 = (AREA_DATA_conflict *)ppAVar6 == area_first;
        pAVar1->prev = pAVar3;
        if (bVar7) {
          ((AREA_DATA_conflict *)ppAVar6)->prev = pAVar1;
          pAVar1->next = (AREA_DATA_conflict *)ppAVar6;
          ((AREA_DATA_conflict *)ppAVar6)->next = pAVar2;
          bVar7 = false;
          area_first = pAVar1;
        }
        else {
          pAVar3->next = pAVar1;
          pAVar1 = ((AREA_DATA_conflict *)ppAVar6)->next;
          ((AREA_DATA_conflict *)ppAVar6)->prev = pAVar1;
          pAVar2 = pAVar1->next;
          pAVar1->next = (AREA_DATA_conflict *)ppAVar6;
          ((AREA_DATA_conflict *)ppAVar6)->next = pAVar2;
          bVar7 = false;
        }
      }
    }
    ppAVar6 = &area_first;
    bVar4 = !bVar7;
    bVar7 = true;
  } while (bVar4);
  iVar5 = 0;
  ppAVar6 = &area_first;
  while (ppAVar6 = &((AREA_DATA_conflict *)ppAVar6)->next->next,
        (AREA_DATA_conflict *)ppAVar6 != (AREA_DATA_conflict *)0x0) {
    ((AREA_DATA_conflict *)ppAVar6)->vnum = iVar5;
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void sort_areas(void)
{
	AREA_DATA *placeholder;
	AREA_DATA *pArea;
	bool sorted= false;
	bool first= false;
	int vnum = 0;

	while (!sorted)
	{
		sorted = true;

		for (pArea = area_first; pArea; pArea = pArea->next)
		{
			first= false;

			if (!pArea->next)
				break;

			if (pArea == area_first)
				first = true;

			if (pArea->min_vnum > pArea->next->min_vnum)
			{
				sorted= false;

				if (pArea->next->next)
					pArea->next->next->prev = pArea;

				pArea->next->prev = pArea->prev;

				if (!first)
					pArea->prev->next = pArea->next;

				pArea->prev = pArea->next;
				placeholder = pArea->next->next;
				pArea->next->next = pArea;
				pArea->next = placeholder;

				if (first)
					area_first = pArea->prev;
			}
		}
	}

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		pArea->vnum = vnum;
		vnum++;
	}
}